

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void idx2::Insert<unsigned_long,idx2::chunk_exp_info>
               (iterator *It,unsigned_long *Key,chunk_exp_info *Val)

{
  long lVar1;
  iterator *ItIn;
  long lVar2;
  iterator local_50;
  chunk_exp_info *local_30;
  chunk_exp_info *Val_local;
  unsigned_long *Key_local;
  iterator *It_local;
  unsigned_long local_10;
  
  *It->Key = *Key;
  local_30 = Val;
  Val_local = (chunk_exp_info *)Key;
  Key_local = (unsigned_long *)It;
  memcpy(It->Val,Val,0x90);
  *(undefined1 *)(*(long *)(Key_local[2] + 0x10) + Key_local[3]) = 2;
  *(long *)(Key_local[2] + 0x18) = *(long *)(Key_local[2] + 0x18) + 1;
  local_10 = Key_local[2];
  lVar1 = *(long *)(local_10 + 0x18) * 10;
  It_local = (iterator *)Key_local[2];
  lVar2 = 1L << ((byte)It_local[1].Key & 0x3f);
  ItIn = (iterator *)(lVar2 * 7);
  if (SBORROW8(lVar1,(long)ItIn) == lVar1 + lVar2 * -7 < 0) {
    IncreaseCapacity<unsigned_long,idx2::chunk_exp_info>
              (&local_50,(idx2 *)Key_local[2],
               (hash_table<unsigned_long,_idx2::chunk_exp_info> *)Key_local,ItIn);
    *Key_local = (unsigned_long)local_50.Key;
    Key_local[1] = (unsigned_long)local_50.Val;
    Key_local[2] = (unsigned_long)local_50.Ht;
    Key_local[3] = local_50.Idx;
  }
  return;
}

Assistant:

void
Insert(typename hash_table<k, v>::iterator* It, const k& Key, const v& Val)
{
  idx2_Assert((*It) != End(*(It->Ht)));
  *(It->Key) = Key;
  *(It->Val) = Val;
  It->Ht->Stats[It->Idx] = hash_table<k, v>::Occupied;
  ++It->Ht->Size;

  if (Size(*(It->Ht)) * 10 >= Capacity(*(It->Ht)) * 7)
  {
    *(It) = IncreaseCapacity(It->Ht, *It);
  }
}